

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetPropertyStr(JSContext *ctx,JSValue this_obj,char *prop,JSValue val)

{
  int iVar1;
  JSContext *in_RCX;
  int ret;
  JSAtom atom;
  JSAtom in_stack_00000164;
  JSContext *in_stack_00000168;
  undefined1 in_stack_00000170 [16];
  undefined1 in_stack_00000180 [16];
  int in_stack_00000240;
  JSAtom in_stack_ffffffffffffffbc;
  JSContext *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  JS_NewAtom(in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = JS_SetPropertyInternal
                    (in_stack_00000168,(JSValue)in_stack_00000180,in_stack_00000164,
                     (JSValue)in_stack_00000170,in_stack_00000240);
  JS_FreeAtom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  return iVar1;
}

Assistant:

int JS_SetPropertyStr(JSContext *ctx, JSValueConst this_obj,
                      const char *prop, JSValue val)
{
    JSAtom atom;
    int ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, JS_PROP_THROW);
    JS_FreeAtom(ctx, atom);
    return ret;
}